

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

float nk_layout_row_calculate_usable_space
                (nk_style *style,nk_panel_type type,float total_space,int columns)

{
  float fVar1;
  int iVar2;
  nk_vec2 nVar3;
  
  iVar2 = 1;
  if (1 < columns) {
    iVar2 = columns;
  }
  fVar1 = (style->window).spacing.x;
  nVar3 = nk_panel_get_padding(style,type);
  return (total_space - (nVar3.x + nVar3.x)) - (float)(iVar2 + -1) * fVar1;
}

Assistant:

NK_LIB float
nk_layout_row_calculate_usable_space(const struct nk_style *style, enum nk_panel_type type,
    float total_space, int columns)
{
    float panel_padding;
    float panel_spacing;
    float panel_space;

    struct nk_vec2 spacing;
    struct nk_vec2 padding;

    spacing = style->window.spacing;
    padding = nk_panel_get_padding(style, type);

    /* calculate the usable panel space */
    panel_padding = 2 * padding.x;
    panel_spacing = (float)NK_MAX(columns - 1, 0) * spacing.x;
    panel_space  = total_space - panel_padding - panel_spacing;
    return panel_space;
}